

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# modified.cpp
# Opt level: O0

void __thiscall modified::restore(modified *this)

{
  branch_and_reduce_algorithm *pbVar1;
  branch_and_reduce_algorithm *pbVar2;
  bool bVar3;
  size_type sVar4;
  reference pvVar5;
  reference pvVar6;
  reference this_00;
  reference piVar7;
  iterator iStack_50;
  int u;
  iterator __end2;
  iterator __begin2;
  value_type *__range2;
  int outV;
  int inV;
  int i;
  int v;
  iterator __end1;
  iterator __begin1;
  vector<int,_std::allocator<int>_> *__range1;
  modified *this_local;
  
  this->pAlg->crt = this->pAlg->crt - this->add;
  sVar4 = std::vector<int,_std::allocator<int>_>::size(&this->removed);
  this->pAlg->rn = this->pAlg->rn + (int)sVar4;
  __end1 = std::vector<int,_std::allocator<int>_>::begin(&this->removed);
  _i = std::vector<int,_std::allocator<int>_>::end(&this->removed);
  while( true ) {
    bVar3 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                               &i);
    if (!bVar3) break;
    piVar7 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator*
                       (&__end1);
    pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](&this->pAlg->x,(long)*piVar7);
    *pvVar6 = -1;
    __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
              (&__end1);
  }
  outV = 0;
  while( true ) {
    sVar4 = std::vector<int,_std::allocator<int>_>::size(&this->vs);
    if ((int)sVar4 <= outV) break;
    pvVar5 = std::
             vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ::operator[](&this->oldAdj,(long)outV);
    pbVar1 = this->pAlg;
    pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](&this->vs,(long)outV);
    this_00 = std::
              vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
              ::operator[](&pbVar1->adj,(long)*pvVar6);
    std::vector<int,_std::allocator<int>_>::operator=(this_00,pvVar5);
    pbVar1 = this->pAlg;
    pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](&this->vs,(long)outV);
    pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](&pbVar1->in,(long)*pvVar6);
    __range2._4_4_ = *pvVar6;
    pbVar1 = this->pAlg;
    pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](&this->vs,(long)outV);
    pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](&pbVar1->out,(long)*pvVar6);
    __range2._0_4_ = *pvVar6;
    pbVar1 = this->pAlg;
    pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](&this->vs,(long)outV);
    pvVar5 = std::
             vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ::operator[](&pbVar1->adj,(long)*pvVar6);
    __end2 = std::vector<int,_std::allocator<int>_>::begin(pvVar5);
    iStack_50 = std::vector<int,_std::allocator<int>_>::end(pvVar5);
    while( true ) {
      bVar3 = __gnu_cxx::operator!=(&__end2,&stack0xffffffffffffffb0);
      if (!bVar3) break;
      piVar7 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
               operator*(&__end2);
      if (*piVar7 == __range2._4_4_) {
        __range2._4_4_ = -1;
      }
      if (*piVar7 == (value_type)__range2) {
        __range2._0_4_ = -1;
      }
      __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                (&__end2);
    }
    if (-1 < __range2._4_4_) {
      pbVar1 = this->pAlg;
      pbVar2 = this->pAlg;
      pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](&this->vs,(long)outV);
      pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](&pbVar2->in,(long)*pvVar6);
      pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](&pbVar1->out,(long)*pvVar6);
      *pvVar6 = -1;
      pbVar1 = this->pAlg;
      pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](&this->vs,(long)outV);
      pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](&pbVar1->in,(long)*pvVar6);
      *pvVar6 = -1;
    }
    if (-1 < (value_type)__range2) {
      pbVar1 = this->pAlg;
      pbVar2 = this->pAlg;
      pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](&this->vs,(long)outV);
      pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](&pbVar2->out,(long)*pvVar6);
      pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](&pbVar1->in,(long)*pvVar6);
      *pvVar6 = -1;
      pbVar1 = this->pAlg;
      pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](&this->vs,(long)outV);
      pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](&pbVar1->out,(long)*pvVar6);
      *pvVar6 = -1;
    }
    outV = outV + 1;
  }
  return;
}

Assistant:

void modified::restore() {
    pAlg->crt -= add;
    pAlg->rn += removed.size();
    for (int v : removed) pAlg->x[v] = -1;
    for (int i = 0; i < static_cast<int>(vs.size()); i++) {
        pAlg->adj[vs[i]] = oldAdj[i];
        int inV = pAlg->in[vs[i]], outV = pAlg->out[vs[i]];
        for (int u : pAlg->adj[vs[i]]) {
            if (u == inV) inV = -1;
            if (u == outV) outV = -1;
        }
        if (inV >= 0) {
            pAlg->out[pAlg->in[vs[i]]] = -1;
            pAlg->in[vs[i]] = -1;
        }
        if (outV >= 0) {
            pAlg->in[pAlg->out[vs[i]]] = -1;
            pAlg->out[vs[i]] = -1;
        }
    }
}